

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

int __thiscall
musicBlock::occupyChannel
          (musicBlock *this,uint slot,uint channel,int note,int volume,OP2instrEntry *instrument,
          uchar secondary)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  channelEntry *pcVar4;
  channelEntry *ch;
  OPL2instrument *instr;
  OP2instrEntry *instrument_local;
  int volume_local;
  int note_local;
  uint channel_local;
  uint slot_local;
  musicBlock *this_local;
  
  pcVar4 = this->channels + slot;
  pcVar4->channel = (uchar)channel;
  pcVar4->note = (uchar)note;
  pcVar4->flags = secondary != '\0';
  if (0x27 < (this->driverdata).channelModulation[channel]) {
    pcVar4->flags = pcVar4->flags | 4;
  }
  pcVar4->time = this->MLtime;
  if (volume == -1) {
    instrument_local._0_4_ = (uint)(this->driverdata).channelLastVolume[channel];
  }
  else {
    (this->driverdata).channelLastVolume[channel] = (uchar)volume;
    instrument_local._0_4_ = volume;
  }
  bVar1 = (this->driverdata).channelVolume[channel];
  bVar2 = (this->driverdata).channelExpression[channel];
  pcVar4->volume = (uint)instrument_local;
  uVar3 = calcVolume(this,(uint)bVar1,(uint)bVar2,(uint)instrument_local);
  pcVar4->realvolume = uVar3;
  if ((instrument->flags & 1) == 0) {
    instrument_local._4_4_ = note;
    if (channel == 0xf) {
      instrument_local._4_4_ = 0x3c;
    }
  }
  else {
    instrument_local._4_4_ = (uint)instrument->note;
  }
  if ((secondary == '\0') || ((instrument->flags & 4) == 0)) {
    pcVar4->finetune = '\0';
  }
  else {
    pcVar4->finetune = (schar)((int)(instrument->finetune - 0x80) >> 1);
  }
  pcVar4->pitch = (int)pcVar4->finetune + (int)(this->driverdata).channelPitch[channel];
  if (secondary == '\0') {
    ch = (channelEntry *)instrument->instr;
  }
  else {
    ch = (channelEntry *)(instrument->instr + 1);
  }
  pcVar4->instr = (OPL2instrument *)ch;
  if ((channel != 0xf) && ((instrument->flags & 1) == 0)) {
    instrument_local._4_4_ = (int)*(short *)((long)&ch->volume + 2) + instrument_local._4_4_;
    if ((int)instrument_local._4_4_ < 0) {
      do {
        instrument_local._4_4_ = instrument_local._4_4_ + 0xc;
      } while ((int)instrument_local._4_4_ < 0);
    }
    else {
      for (; 0x7f < (int)instrument_local._4_4_;
          instrument_local._4_4_ = instrument_local._4_4_ - 0xc) {
      }
    }
  }
  pcVar4->realnote = (uchar)instrument_local._4_4_;
  OPLio::OPLwriteInstrument(this->io,slot,(OPL2instrument *)ch);
  if ((pcVar4->flags & 4) != 0) {
    writeModulation(this,slot,(OPL2instrument *)ch,1);
  }
  OPLio::OPLwritePan(this->io,slot,(OPL2instrument *)ch,(int)(this->driverdata).channelPan[channel])
  ;
  OPLio::OPLwriteVolume(this->io,slot,(OPL2instrument *)ch,pcVar4->realvolume);
  writeFrequency(this,slot,instrument_local._4_4_,pcVar4->pitch,1);
  return slot;
}

Assistant:

int musicBlock::occupyChannel(uint slot, uint channel,
						 int note, int volume, struct OP2instrEntry *instrument, uchar secondary)
{
	struct OPL2instrument *instr;
	struct channelEntry *ch = &channels[slot];

	ch->channel = channel;
	ch->note = note;
	ch->flags = secondary ? CH_SECONDARY : 0;
	if (driverdata.channelModulation[channel] >= MOD_MIN)
		ch->flags |= CH_VIBRATO;
	ch->time = MLtime;
	if (volume == -1)
		volume = driverdata.channelLastVolume[channel];
	else
		driverdata.channelLastVolume[channel] = volume;
	ch->realvolume = calcVolume(driverdata.channelVolume[channel],
		driverdata.channelExpression[channel], ch->volume = volume);
	if (instrument->flags & FL_FIXED_PITCH)
		note = instrument->note;
	else if (channel == PERCUSSION)
		note = 60;			// C-5
	if (secondary && (instrument->flags & FL_DOUBLE_VOICE))
		ch->finetune = (instrument->finetune - 0x80) >> 1;
	else
		ch->finetune = 0;
	ch->pitch = ch->finetune + driverdata.channelPitch[channel];
	if (secondary)
		instr = &instrument->instr[1];
	else
		instr = &instrument->instr[0];
	ch->instr = instr;
	if (channel != PERCUSSION && !(instrument->flags & FL_FIXED_PITCH))
	{
		if ( (note += instr->basenote) < 0)
			while ((note += 12) < 0) {}
		else if (note > HIGHEST_NOTE)
			while ((note -= 12) > HIGHEST_NOTE) {}
	}
	ch->realnote = note;

	io->OPLwriteInstrument(slot, instr);
	if (ch->flags & CH_VIBRATO)
		writeModulation(slot, instr, 1);
	io->OPLwritePan(slot, instr, driverdata.channelPan[channel]);
	io->OPLwriteVolume(slot, instr, ch->realvolume);
	writeFrequency(slot, note, ch->pitch, 1);
	return slot;
}